

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.hh
# Opt level: O0

void phosg::strip_trailing_whitespace<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  size_t index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  
  sVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_not_of(s," \t\r\n",0xffffffffffffffff);
  if (sVar2 == 0xffffffffffffffff) {
    bVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (s);
    if ((!bVar1) &&
       ((((pvVar3 = ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                              (s,0), *pvVar3 == ' ' ||
          (pvVar3 = ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                              (s,0), *pvVar3 == '\t')) ||
         (pvVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::operator[](s,0), *pvVar3 == '\r')) ||
        (pvVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::operator[](s,0), *pvVar3 == '\n')))) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize(s,0)
      ;
    }
  }
  else {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (s,sVar2 + 1);
  }
  return;
}

Assistant:

void strip_trailing_whitespace(StrT& s) {
  size_t index = s.find_last_not_of(" \t\r\n");
  if (index != StrT::npos) {
    s.resize(index + 1);
  } else if (!s.empty() &&
      ((s[0] == ' ') || (s[0] == '\t') || (s[0] == '\r') || (s[0] == '\n'))) {
    s.resize(0); // String is entirely whitespace
  }
}